

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

FederateState * __thiscall
helics::CommonCore::getFederateAt(CommonCore *this,LocalFederateId federateID)

{
  pointer puVar1;
  _Head_base<0UL,_helics::FederateState_*,_false> _Var2;
  shared_handle feds;
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(&local_28,&this->federates);
  puVar1 = ((local_28.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)federateID.fid <
      (ulong)((long)((local_28.data)->dataStorage).
                    super__Vector_base<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>,_std::allocator<std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var2._M_head_impl =
         *(FederateState **)
          &puVar1[federateID.fid]._M_t.
           super___uniq_ptr_impl<helics::FederateState,_std::default_delete<helics::FederateState>_>
    ;
  }
  else {
    _Var2._M_head_impl = (FederateState *)0x0;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28.m_handle_lock);
  return (FederateState *)
         (_Tuple_impl<0UL,_helics::FederateState_*,_std::default_delete<helics::FederateState>_>)
         _Var2._M_head_impl;
}

Assistant:

FederateState* CommonCore::getFederateAt(LocalFederateId federateID) const
{
    auto feds = federates.lock();
    return (*feds)[federateID.baseValue()];
}